

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisetTest.cpp
# Opt level: O2

void print<std::multiset<int,std::less<int>,std::allocator<int>>>
               (multiset<int,_std::less<int>,_std::allocator<int>_> *t,char *s)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  for (p_Var2 = (t->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(t->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,' ');
    std::ostream::operator<<(poVar1,p_Var2[1]._M_color);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}